

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exporter.cpp
# Opt level: O3

aiReturn __thiscall Assimp::Exporter::RegisterExporter(Exporter *this,ExportFormatEntry *desc)

{
  pointer *ppEVar1;
  ExporterPimpl *pEVar2;
  iterator __position;
  char *pcVar3;
  char *pcVar4;
  fpExportFunc p_Var5;
  undefined4 uVar6;
  int iVar7;
  ExportFormatEntry *e;
  ExportFormatEntry *pEVar8;
  
  pEVar2 = this->pimpl;
  pEVar8 = (pEVar2->mExporters).
           super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  __position._M_current =
       (pEVar2->mExporters).
       super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (pEVar8 != __position._M_current) {
    pcVar3 = (desc->mDescription).id;
    do {
      iVar7 = strcmp((pEVar8->mDescription).id,pcVar3);
      if (iVar7 == 0) {
        return aiReturn_FAILURE;
      }
      pEVar8 = pEVar8 + 1;
    } while (pEVar8 != __position._M_current);
  }
  if (__position._M_current ==
      (pEVar2->mExporters).
      super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Assimp::Exporter::ExportFormatEntry,std::allocator<Assimp::Exporter::ExportFormatEntry>>
    ::_M_realloc_insert<Assimp::Exporter::ExportFormatEntry_const&>
              ((vector<Assimp::Exporter::ExportFormatEntry,std::allocator<Assimp::Exporter::ExportFormatEntry>>
                *)&pEVar2->mExporters,__position,desc);
  }
  else {
    uVar6 = *(undefined4 *)&desc->field_0x24;
    (__position._M_current)->mEnforcePP = desc->mEnforcePP;
    *(undefined4 *)&(__position._M_current)->field_0x24 = uVar6;
    pcVar3 = (desc->mDescription).id;
    pcVar4 = (desc->mDescription).description;
    p_Var5 = desc->mExportFunction;
    ((__position._M_current)->mDescription).fileExtension = (desc->mDescription).fileExtension;
    (__position._M_current)->mExportFunction = p_Var5;
    ((__position._M_current)->mDescription).id = pcVar3;
    ((__position._M_current)->mDescription).description = pcVar4;
    ppEVar1 = &(pEVar2->mExporters).
               super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppEVar1 = *ppEVar1 + 1;
  }
  return aiReturn_SUCCESS;
}

Assistant:

aiReturn Exporter::RegisterExporter(const ExportFormatEntry& desc) {
    for(const ExportFormatEntry& e : pimpl->mExporters) {
        if (!strcmp(e.mDescription.id,desc.mDescription.id)) {
            return aiReturn_FAILURE;
        }
    }

    pimpl->mExporters.push_back(desc);
    return aiReturn_SUCCESS;
}